

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PimplImpl.h
# Opt level: O3

void __thiscall
celero::Pimpl<celero::ResultTable::Impl>::Pimpl(Pimpl<celero::ResultTable::Impl> *this)

{
  _Head_base<0UL,_celero::ResultTable::Impl_*,_false> this_00;
  
  this_00._M_head_impl = (Impl *)operator_new(0x210);
  std::ofstream::ofstream(this_00._M_head_impl);
  (this_00._M_head_impl)->precision = 5;
  (this_00._M_head_impl)->hasWrittenHeader = false;
  (this->_pimpl)._M_t.
  super___uniq_ptr_impl<celero::ResultTable::Impl,_std::default_delete<celero::ResultTable::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_celero::ResultTable::Impl_*,_std::default_delete<celero::ResultTable::Impl>_>
  .super__Head_base<0UL,_celero::ResultTable::Impl_*,_false>._M_head_impl = this_00._M_head_impl;
  return;
}

Assistant:

Pimpl<T>::Pimpl() : _pimpl(new T())
	{
	}